

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctred.c
# Opt level: O1

void jpeg_idct_4x4(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  JSAMPLE *pJVar9;
  JSAMPLE JVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int aiStack_d4 [7];
  int aiStack_b8 [34];
  
  pJVar1 = cinfo->sample_range_limit;
  pvVar2 = compptr->dct_table;
  uVar7 = 9;
  lVar8 = 0;
  do {
    if ((int)lVar8 != 8) {
      lVar16 = (long)*(short *)((long)coef_block + lVar8 + 0x10);
      if ((((lVar16 == 0) && (*(short *)((long)coef_block + lVar8 + 0x20) == 0)) &&
          (*(short *)((long)coef_block + lVar8 + 0x30) == 0)) &&
         (((*(short *)((long)coef_block + lVar8 + 0x50) == 0 &&
           (*(short *)((long)coef_block + lVar8 + 0x60) == 0)) &&
          (*(short *)((long)coef_block + lVar8 + 0x70) == 0)))) {
        iVar11 = (int)*(short *)((long)pvVar2 + lVar8) * (int)*(short *)((long)coef_block + lVar8) *
                 4;
        *(int *)((long)aiStack_d4 + lVar8 * 2 + 0x1c) = iVar11;
        *(int *)((long)aiStack_d4 + lVar8 * 2 + 0x3c) = iVar11;
        *(int *)((long)aiStack_d4 + lVar8 * 2 + 0x5c) = iVar11;
        lVar16 = 0x60;
      }
      else {
        lVar4 = (long)*(short *)((long)pvVar2 + lVar8) * (long)*(short *)((long)coef_block + lVar8)
                * 0x4000;
        lVar18 = (long)*(short *)((long)pvVar2 + lVar8 + 0x60) *
                 (long)*(short *)((long)coef_block + lVar8 + 0x60) * -0x187e +
                 (long)*(short *)((long)pvVar2 + lVar8 + 0x20) *
                 (long)*(short *)((long)coef_block + lVar8 + 0x20) * 0x3b21;
        lVar13 = lVar4 - lVar18;
        lVar14 = (long)*(short *)((long)pvVar2 + lVar8 + 0x70) *
                 (long)*(short *)((long)coef_block + lVar8 + 0x70);
        lVar6 = (long)*(short *)((long)pvVar2 + lVar8 + 0x50) *
                (long)*(short *)((long)coef_block + lVar8 + 0x50);
        lVar12 = (long)*(short *)((long)pvVar2 + lVar8 + 0x30) *
                 (long)*(short *)((long)coef_block + lVar8 + 0x30);
        lVar16 = *(short *)((long)pvVar2 + lVar8 + 0x10) * lVar16;
        lVar17 = lVar16 * 0x21f9 + lVar12 * -0x4587 + lVar6 * 0x2e75 + lVar14 * -0x6c2;
        lVar16 = lVar16 * 0x5203 + lVar12 * 0x1ccd + lVar6 * -0x133e + lVar14 * -0x1050;
        lVar18 = lVar4 + 0x800 + lVar18;
        *(int *)((long)aiStack_d4 + lVar8 * 2 + 0x1c) = (int)((ulong)(lVar18 + lVar16) >> 0xc);
        *(int *)((long)aiStack_d4 + lVar8 * 2 + 0x7c) = (int)((ulong)(lVar18 - lVar16) >> 0xc);
        *(int *)((long)aiStack_d4 + lVar8 * 2 + 0x3c) = (int)(lVar13 + lVar17 + 0x800U >> 0xc);
        iVar11 = (int)((ulong)((lVar13 + 0x800) - lVar17) >> 0xc);
        lVar16 = 0x40;
      }
      *(int *)((long)aiStack_d4 + lVar8 * 2 + lVar16 + 0x1c) = iVar11;
    }
    uVar7 = uVar7 - 1;
    lVar8 = lVar8 + 2;
  } while (1 < uVar7);
  lVar8 = 7;
  do {
    pJVar9 = (JSAMPLE *)(*(long *)((long)output_buf + lVar8 + -7) + (ulong)output_col);
    iVar11 = aiStack_d4[lVar8 + 1];
    if (((iVar11 == 0) && (aiStack_d4[lVar8 + 2] == 0)) &&
       ((aiStack_d4[lVar8 + 3] == 0 &&
        (((aiStack_d4[lVar8 + 5] == 0 && (aiStack_d4[lVar8 + 6] == 0)) &&
         (aiStack_d4[lVar8 + 7] == 0)))))) {
      JVar10 = pJVar1[(ulong)(aiStack_d4[lVar8] + 0x10U >> 5 & 0x3ff) + 0x80];
      *pJVar9 = JVar10;
      pJVar9[1] = JVar10;
      pJVar9[2] = JVar10;
      lVar16 = 3;
    }
    else {
      iVar5 = aiStack_d4[lVar8 + 6] * -0x187e + aiStack_d4[lVar8 + 2] * 0x3b21;
      iVar3 = aiStack_d4[lVar8] * 0x4000 - iVar5;
      iVar15 = iVar11 * 0x21f9 + aiStack_d4[lVar8 + 7] * -0x6c2 +
               aiStack_d4[lVar8 + 3] * -0x4587 + aiStack_d4[lVar8 + 5] * 0x2e75;
      iVar11 = iVar11 * 0x5203 + aiStack_d4[lVar8 + 7] * -0x1050 +
               aiStack_d4[lVar8 + 3] * 0x1ccd + aiStack_d4[lVar8 + 5] * -0x133e;
      iVar5 = aiStack_d4[lVar8] * 0x4000 + 0x40000 + iVar5;
      *pJVar9 = pJVar1[(ulong)((uint)(iVar5 + iVar11) >> 0x13 & 0x3ff) + 0x80];
      pJVar9[3] = pJVar1[(ulong)((uint)(iVar5 - iVar11) >> 0x13 & 0x3ff) + 0x80];
      pJVar9[1] = pJVar1[(ulong)(iVar3 + iVar15 + 0x40000U >> 0x13 & 0x3ff) + 0x80];
      JVar10 = pJVar1[(ulong)((uint)((iVar3 + 0x40000) - iVar15) >> 0x13 & 0x3ff) + 0x80];
      lVar16 = 2;
    }
    pJVar9[lVar16] = JVar10;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x27);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_4x4(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp2, tmp10, tmp12;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE * 4];   /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; inptr++, quantptr++, wsptr++, ctr--) {
    /* Don't bother to process column 4, because second pass won't use it */
    if (ctr == DCTSIZE - 4)
      continue;
    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 5] == 0 &&
        inptr[DCTSIZE * 6] == 0 && inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero; we need not examine term 4 for 4x4 output */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                                        quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;

      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS + 1);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp2 = MULTIPLY(z2, FIX_1_847759065) + MULTIPLY(z3, -FIX_0_765366865);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);

    tmp0 = MULTIPLY(z1, -FIX_0_211164243) + /* sqrt(2) * ( c3-c1) */
           MULTIPLY(z2,  FIX_1_451774981) + /* sqrt(2) * ( c3+c7) */
           MULTIPLY(z3, -FIX_2_172734803) + /* sqrt(2) * (-c1-c5) */
           MULTIPLY(z4,  FIX_1_061594337);  /* sqrt(2) * ( c5+c7) */

    tmp2 = MULTIPLY(z1, -FIX_0_509795579) + /* sqrt(2) * (c7-c5) */
           MULTIPLY(z2, -FIX_0_601344887) + /* sqrt(2) * (c5-c1) */
           MULTIPLY(z3,  FIX_0_899976223) + /* sqrt(2) * (c3-c7) */
           MULTIPLY(z4,  FIX_2_562915447);  /* sqrt(2) * (c1+c3) */

    /* Final output stage */

    wsptr[DCTSIZE * 0] =
      (int)DESCALE(tmp10 + tmp2, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 3] =
      (int)DESCALE(tmp10 - tmp2, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 1] =
      (int)DESCALE(tmp12 + tmp0, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 2] =
      (int)DESCALE(tmp12 - tmp0, CONST_BITS - PASS1_BITS + 1);
  }

  /* Pass 2: process 4 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 4; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* It's not clear whether a zero row test is worthwhile here ... */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp0 = LEFT_SHIFT((JLONG)wsptr[0], CONST_BITS + 1);

    tmp2 = MULTIPLY((JLONG)wsptr[2],  FIX_1_847759065) +
           MULTIPLY((JLONG)wsptr[6], -FIX_0_765366865);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    /* Odd part */

    z1 = (JLONG)wsptr[7];
    z2 = (JLONG)wsptr[5];
    z3 = (JLONG)wsptr[3];
    z4 = (JLONG)wsptr[1];

    tmp0 = MULTIPLY(z1, -FIX_0_211164243) + /* sqrt(2) * ( c3-c1) */
           MULTIPLY(z2,  FIX_1_451774981) + /* sqrt(2) * ( c3+c7) */
           MULTIPLY(z3, -FIX_2_172734803) + /* sqrt(2) * (-c1-c5) */
           MULTIPLY(z4,  FIX_1_061594337);  /* sqrt(2) * ( c5+c7) */

    tmp2 = MULTIPLY(z1, -FIX_0_509795579) + /* sqrt(2) * (c7-c5) */
           MULTIPLY(z2, -FIX_0_601344887) + /* sqrt(2) * (c5-c1) */
           MULTIPLY(z3, FIX_0_899976223) +  /* sqrt(2) * (c3-c7) */
           MULTIPLY(z4, FIX_2_562915447);   /* sqrt(2) * (c1+c3) */

    /* Final output stage */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp2,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)DESCALE(tmp10 - tmp2,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp12 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)DESCALE(tmp12 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}